

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O0

int v_scroll_top_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  int ret;
  int scroll_border;
  Am_Widget_Look look;
  int group_border;
  Am_Object group;
  Am_Object *self_local;
  
  group.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner((Am_Object *)&stack0xffffffffffffffe8,(Am_Slot_Flags)self);
  iVar2 = get_scroll_border_thickness((Am_Object *)&stack0xffffffffffffffe8);
  pAVar4 = Am_Object::Get((Am_Object *)group.data,0x17f,0);
  Am_Widget_Look::Am_Widget_Look((Am_Widget_Look *)&ret,pAVar4);
  bVar1 = Am_Widget_Look::operator==((Am_Widget_Look *)&ret,&Am_MOTIF_LOOK);
  pAVar4 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffe8,0x1c0,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe8);
  return (iVar3 + (uint)bVar1 * -2) - iVar2;
}

Assistant:

Am_Define_Formula(int, v_scroll_top)
{
  Am_Object group = self.Get_Owner();
  int group_border = get_scroll_border_thickness(group);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  int scroll_border = (look == Am_MOTIF_LOOK) ? 2 : 0;
  int ret = (int)group.Get(Am_CLIP_TOP) - scroll_border - group_border;
  return ret;
}